

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool memequals(void *s1,void *s2,size_t n)

{
  _Bool _Var1;
  int iVar2;
  
  if (n == 0) {
    _Var1 = true;
  }
  else {
    _Var1 = croaring_avx2();
    if (_Var1) {
      _Var1 = _avx2_memequals(s1,s2,n);
      return _Var1;
    }
    iVar2 = bcmp(s1,s2,n);
    _Var1 = iVar2 == 0;
  }
  return _Var1;
}

Assistant:

bool memequals(const void *s1, const void *s2, size_t n) {
    if (n == 0) {
        return true;
    }
#ifdef CROARING_IS_X64
    if( croaring_avx2() ) {
      return _avx2_memequals(s1, s2, n);
    } else {
      return memcmp(s1, s2, n) == 0;
    }
#else
    return memcmp(s1, s2, n) == 0;
#endif
}